

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O3

void __thiscall Farm::createTruck(Farm *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  string plate;
  double capacity;
  string local_e0;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  double local_a0;
  double local_98;
  string local_90;
  string local_70;
  Truck local_50;
  
  local_b8 = 0;
  local_b0 = 0;
  local_c0 = &local_b0;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter new truck\'s plate: ",0x19);
  cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x50);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_c0,cVar2);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_c0,local_c0 + local_b8);
  bVar3 = searchTruckByPlate(this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  if (bVar3) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"ERROR: It already exists a truck with the given plate!","");
    cinERR(&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ENTER to go back","");
    enterWait(&local_e0);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"Enter truck\'s capacity: ","");
    getDouble(&local_98,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    local_a0 = local_98;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_c0,local_c0 + local_b8);
    Truck::Truck(&local_50,local_a0,&local_90);
    std::vector<Truck,_std::allocator<Truck>_>::push_back(&this->trucks,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.plate._M_dataplus._M_p != &local_50.plate.field_2) {
      operator_delete(local_50.plate._M_dataplus._M_p,
                      local_50.plate.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    this->farmFileChanged = true;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Truck successfully created!",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    local_e0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"ENTER to go back","");
    enterWait(&local_e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  return;
}

Assistant:

void Farm::createTruck() {
    string plate;
    double capacity;

    cout << "Enter new truck's plate: ";
    getline(cin, plate);
    if(searchTruckByPlate(plate)){
        cinERR("ERROR: It already exists a truck with the given plate!");
        enterWait();
        return;
    }

    getDouble(capacity, "Enter truck's capacity: ");

    addTruck(Truck(capacity, plate));

    farmFileChanged = true;
    cout << "Truck successfully created!" << endl;
    enterWait();
}